

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_repeat_matcher.hpp
# Opt level: O1

bool __thiscall
boost::xpressive::detail::
simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>>>,mpl_::bool_<true>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>>>,mpl_::bool_<true>>
           *this,match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *state,long *next)

{
  char *pcVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  difference_type __d;
  uint uVar7;
  int iVar8;
  matcher_wrapper<boost::xpressive::detail::true_matcher> local_41;
  undefined8 local_40;
  char *local_38;
  
  local_40 = *(undefined8 *)(this + 0x30);
  pcVar1 = (state->cur_)._M_current;
  if (*(int *)(this + 0x2c) == 0) {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    do {
      bVar2 = string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>>
              ::
              match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::true_matcher>>
                        ((string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>>
                          *)this,state,&local_41);
      if (!bVar2) break;
      uVar7 = uVar7 + 1;
    } while (uVar7 < *(uint *)(this + 0x2c));
  }
  if (this[0x38] ==
      (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>>>,mpl_::bool_<true>>
       )0x1) {
    pcVar6 = pcVar1 + ((state->end_)._M_current != pcVar1);
    if (uVar7 < *(uint *)(this + 0x2c)) {
      pcVar6 = (state->cur_)._M_current;
    }
    pcVar5 = pcVar1 + ((state->end_)._M_current != pcVar1);
    if (uVar7 != 0) {
      pcVar5 = pcVar6;
    }
    (state->next_search_)._M_current = pcVar5;
  }
  local_38 = pcVar1;
  if (uVar7 < *(uint *)(this + 0x28)) {
LAB_0012d239:
    (state->cur_)._M_current = local_38;
    bVar2 = false;
  }
  else {
    cVar3 = (**(code **)(*next + 0x10))(next,state);
    bVar2 = true;
    if (cVar3 == '\0') {
      iVar4 = (int)local_40;
      iVar8 = uVar7 + 1;
      do {
        iVar8 = iVar8 + -1;
        if (iVar8 == *(int *)(this + 0x28)) goto LAB_0012d239;
        (state->cur_)._M_current = (state->cur_)._M_current + -iVar4;
        cVar3 = (**(code **)(*next + 0x10))(next,state);
      } while (cVar3 == '\0');
    }
  }
  return bVar2;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, greedy_slow_tag) const
        {
            int const diff = -static_cast<int>(Xpr::width == unknown_width::value ? this->width_ : Xpr::width);
            unsigned int matches = 0;
            BidiIter const tmp = state.cur_;

            // greedily match as much as we can
            while(matches < this->max_ && this->xpr_.match(state))
            {
                ++matches;
            }

            // If this repeater is at the front of the pattern, note
            // how much of the input we consumed so that a repeated search
            // doesn't have to cover the same ground again.
            if(this->leading_)
            {
                state.next_search_ = (matches && matches < this->max_)
                                   ? state.cur_
                                   : (tmp == state.end_) ? tmp : boost::next(tmp);
            }

            if(this->min_ > matches)
            {
                state.cur_ = tmp;
                return false;
            }

            // try matching the rest of the pattern, and back off if necessary
            for(; ; --matches, std::advance(state.cur_, diff))
            {
                if(next.match(state))
                {
                    return true;
                }
                else if(this->min_ == matches)
                {
                    state.cur_ = tmp;
                    return false;
                }
            }
        }